

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HtmlBuilder.h
# Opt level: O1

void __thiscall HTML::CAPTION::CAPTION(CAPTION *this,ostream *stream)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"CAPTION","");
  TAG::TAG(&this->super_TAG,&local_40,stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_TAG)._vptr_TAG = (_func_int **)&PTR__TAG_001ee0b0;
  return;
}

Assistant:

CAPTION( std::ostream& stream )
  : TAG( "CAPTION", stream ) {}